

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O0

ir_function_signature * __thiscall
anon_unknown.dwarf_b1ea9::builtin_builder::_EmitStreamVertex
          (builtin_builder *this,builtin_available_predicate avail,glsl_type *stream_type)

{
  ir_variable *this_00;
  ir_emit_vertex *this_01;
  ir_dereference_variable *stream_00;
  undefined1 local_40 [8];
  ir_factory body;
  ir_function_signature *sig;
  ir_variable *stream;
  glsl_type *stream_type_local;
  builtin_available_predicate avail_local;
  builtin_builder *this_local;
  
  this_00 = (ir_variable *)exec_node::operator_new(0x90,this->mem_ctx);
  ir_variable::ir_variable(this_00,stream_type,"stream",ir_var_const_in);
  body.mem_ctx = new_sig(this,&glsl_type::_void_type,avail,1,this_00);
  ir_builder::ir_factory::ir_factory
            ((ir_factory *)local_40,&((ir_function_signature *)body.mem_ctx)->body,this->mem_ctx);
  *(byte *)((long)body.mem_ctx + 0x48) = *(byte *)((long)body.mem_ctx + 0x48) & 0xfe | 1;
  this_01 = (ir_emit_vertex *)exec_node::operator_new(0x28,this->mem_ctx);
  stream_00 = var_ref(this,this_00);
  ir_emit_vertex::ir_emit_vertex(this_01,(ir_rvalue *)stream_00);
  ir_builder::ir_factory::emit((ir_factory *)local_40,(ir_instruction *)this_01);
  return (ir_function_signature *)body.mem_ctx;
}

Assistant:

ir_function_signature *
builtin_builder::_EmitStreamVertex(builtin_available_predicate avail,
                                   const glsl_type *stream_type)
{
   /* Section 8.12 (Geometry Shader Functions) of the GLSL 4.0 spec says:
    *
    *     "Emit the current values of output variables to the current output
    *     primitive on stream stream. The argument to stream must be a constant
    *     integral expression."
    */
   ir_variable *stream =
      new(mem_ctx) ir_variable(stream_type, "stream", ir_var_const_in);

   MAKE_SIG(glsl_type::void_type, avail, 1, stream);

   body.emit(new(mem_ctx) ir_emit_vertex(var_ref(stream)));

   return sig;
}